

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

void __thiscall acto::core::runtime_t::runtime_t(runtime_t *this)

{
  uint uVar1;
  runtime_t *local_38;
  code *local_30;
  undefined8 local_28;
  
  (this->super_callbacks)._vptr_callbacks = (_func_int **)&PTR__runtime_t_0010ecc8;
  uVar1 = std::thread::hardware_concurrency();
  this->m_processors = (ulong)uVar1;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  event::event(&this->no_actors_event_,false);
  event::event(&this->queue_event_,true);
  event::event(&this->idle_workers_event_,true);
  event::event(&this->no_workers_event_,false);
  (this->actors_)._M_h._M_buckets = &(this->actors_)._M_h._M_single_bucket;
  (this->actors_)._M_h._M_bucket_count = 1;
  (this->actors_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->actors_)._M_h._M_element_count = 0;
  (this->actors_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->workers_).count.super___atomic_base<unsigned_long>._M_i = 0;
  (this->workers_).reserved.super___atomic_base<unsigned_long>._M_i = 0;
  (this->workers_).idle.head_._M_b._M_p = (__pointer_type)0x0;
  (this->actors_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->actors_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->actors_)._M_h._M_single_bucket + 1) = 0;
  *(undefined8 *)((long)&(this->queue_).tail_ + 1) = 0;
  this->active_ = (__atomic_base<bool>)0x1;
  this->terminating_ = (__atomic_base<bool>)0x0;
  local_30 = execute;
  local_28 = 0;
  local_38 = this;
  std::thread::thread<void(acto::core::runtime_t::*)(),acto::core::runtime_t*,void>
            (&this->m_scheduler,(offset_in_runtime_t_to_subr *)&local_30,&local_38);
  event::signaled(&this->no_actors_event_);
  event::signaled(&this->no_workers_event_);
  return;
}

Assistant:

runtime_t::runtime_t()
  : m_scheduler(&runtime_t::execute, this) {
  no_actors_event_.signaled();
  no_workers_event_.signaled();
}